

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digest.h
# Opt level: O0

result_type *
jbcoin::sha512Half<unsigned_short>(result_type *__return_storage_ptr__,unsigned_short *args)

{
  undefined1 local_e8 [8];
  sha512_half_hasher h;
  unsigned_short *args_local;
  
  h.h_.ctx_._208_8_ = args;
  detail::basic_sha512_half_hasher<false>::basic_sha512_half_hasher
            ((basic_sha512_half_hasher<false> *)local_e8);
  beast::hash_append<jbcoin::detail::basic_sha512_half_hasher<false>,unsigned_short>
            ((basic_sha512_half_hasher<false> *)local_e8,*(unsigned_short *)h.h_.ctx_._208_8_);
  detail::basic_sha512_half_hasher::operator_cast_to_base_uint
            (__return_storage_ptr__,(basic_sha512_half_hasher *)local_e8);
  detail::basic_sha512_half_hasher<false>::~basic_sha512_half_hasher
            ((basic_sha512_half_hasher<false> *)local_e8);
  return __return_storage_ptr__;
}

Assistant:

sha512_half_hasher::result_type
sha512Half (Args const&... args)
{
    sha512_half_hasher h;
    using beast::hash_append;
    hash_append(h, args...);
    return static_cast<typename
        sha512_half_hasher::result_type>(h);
}